

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall Highs::completeSolutionFromDiscreteAssignment(Highs *this)

{
  HighsSolution *this_00;
  vector<double,_std::allocator<double>_> *__x;
  vector<double,_std::allocator<double>_> *__x_00;
  vector<HighsVarType,_std::allocator<HighsVarType>_> *__x_01;
  double *pdVar1;
  int iVar2;
  double primal;
  double lower;
  int iVar3;
  HighsInt HVar4;
  pointer pdVar5;
  pointer pHVar6;
  bool bVar7;
  HighsVarType type;
  HighsStatus HVar8;
  char *format;
  int iVar9;
  uint uVar10;
  HighsInt iCol;
  long lVar11;
  double integer_infeasibility;
  double col_infeasibility;
  pointer local_b0;
  pointer local_a8;
  double local_a0;
  vector<HighsVarType,_std::allocator<HighsVarType>_> save_integrality;
  vector<double,_std::allocator<double>_> save_col_upper;
  vector<double,_std::allocator<double>_> save_col_lower;
  string local_50;
  
  this_00 = &this->solution_;
  bVar7 = HighsSolution::hasUndefined(this_00);
  if (!bVar7) {
    std::__cxx11::string::string((string *)&local_50,"",(allocator *)&col_infeasibility);
    assessLpPrimalSolution
              (&local_50,&this->options_,&(this->model_).lp_,this_00,(bool *)&save_col_lower,
               (bool *)&save_col_upper,(bool *)&save_integrality);
    std::__cxx11::string::~string((string *)&local_50);
    if ((char)save_integrality.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
              _M_impl.super__Vector_impl_data._M_start != '\0') {
      return kOk;
    }
  }
  __x = &(this->model_).lp_.col_lower_;
  std::vector<double,_std::allocator<double>_>::vector(&save_col_lower,__x);
  __x_00 = &(this->model_).lp_.col_upper_;
  std::vector<double,_std::allocator<double>_>::vector(&save_col_upper,__x_00);
  __x_01 = &(this->model_).lp_.integrality_;
  std::vector<HighsVarType,_std::allocator<HighsVarType>_>::vector(&save_integrality,__x_01);
  local_a8 = (this->model_).lp_.integrality_.
             super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_b0 = (this->model_).lp_.integrality_.
             super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
             super__Vector_impl_data._M_finish;
  iVar9 = 0;
  uVar10 = 0;
  for (lVar11 = 0; iVar3 = (this->model_).lp_.num_col_, lVar11 < iVar3; lVar11 = lVar11 + 1) {
    pdVar5 = (this->solution_).col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl
             .super__Vector_impl_data._M_start;
    primal = pdVar5[lVar11];
    lower = (this->model_).lp_.col_lower_.super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar11];
    pdVar5[lVar11] = lower;
    type = (this->model_).lp_.integrality_.
           super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
           super__Vector_impl_data._M_start[lVar11];
    if (type != kContinuous) {
      if (primal < INFINITY) {
        if (local_b0 == local_a8) {
          type = kContinuous;
        }
        col_infeasibility = 0.0;
        integer_infeasibility = 0.0;
        local_a0 = primal;
        assessColPrimalSolution
                  (&this->options_,primal,lower,
                   (__x_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[lVar11],type,&col_infeasibility,
                   &integer_infeasibility);
        pdVar1 = &(this->options_).super_HighsOptionsStruct.mip_feasibility_tolerance;
        if (integer_infeasibility < *pdVar1 || integer_infeasibility == *pdVar1) {
          uVar10 = uVar10 + 1;
          (__x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
          ._M_start[lVar11] = local_a0;
          (__x_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar11] = local_a0;
          (__x_01->super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar11] = kContinuous;
        }
        else {
          iVar9 = iVar9 + 1;
        }
      }
      else {
        iVar9 = iVar9 + 1;
      }
    }
  }
  iVar2 = uVar10 + iVar9;
  if (iVar9 == 0) {
    if (iVar3 == iVar2) {
      bVar7 = false;
      highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kInfo,
                   "User-supplied values of discrete variables cannot yield feasible solution\n");
    }
    else {
      pHVar6 = (this->model_).lp_.integrality_.
               super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->model_).lp_.integrality_.
          super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
          super__Vector_impl_data._M_finish != pHVar6) {
        (this->model_).lp_.integrality_.
        super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
        super__Vector_impl_data._M_finish = pHVar6;
      }
      bVar7 = true;
      highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kInfo,
                   "Attempting to find feasible solution by solving LP for user-supplied values of discrete variables\n"
                  );
    }
  }
  else {
    format = 
    "Attempting to find feasible solution by solving MIP for user-supplied values of %d / %d discrete variables\n"
    ;
    if ((int)(uVar10 * 10) < iVar2) {
      format = 
      "User-supplied values fix only %d / %d discrete variables, so attempt to complete a feasible solution may be expensive\n"
      ;
    }
    bVar7 = true;
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,
                 (uint)((int)(uVar10 * 10) < iVar2) * 3 + kInfo,format,(ulong)uVar10);
  }
  HighsSolution::clear(this_00);
  if (bVar7) {
    HVar4 = (this->options_).super_HighsOptionsStruct.mip_max_nodes;
    (this->options_).super_HighsOptionsStruct.mip_max_nodes =
         (this->options_).super_HighsOptionsStruct.mip_max_start_nodes;
    HighsBasis::clear(&this->basis_);
    HVar8 = run(this);
    (this->options_).super_HighsOptionsStruct.mip_max_nodes = HVar4;
    bVar7 = HVar8 == kError;
  }
  else {
    bVar7 = false;
  }
  std::vector<double,_std::allocator<double>_>::operator=(__x,&save_col_lower);
  std::vector<double,_std::allocator<double>_>::operator=(__x_00,&save_col_upper);
  std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator=(__x_01,&save_integrality);
  HVar8 = kOk;
  if (bVar7) {
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                 "Highs::run() error trying to find feasible solution\n");
    HVar8 = kError;
  }
  std::_Vector_base<HighsVarType,_std::allocator<HighsVarType>_>::~_Vector_base
            (&save_integrality.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&save_col_upper.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&save_col_lower.super__Vector_base<double,_std::allocator<double>_>);
  return HVar8;
}

Assistant:

HighsStatus Highs::completeSolutionFromDiscreteAssignment() {
  // Determine whether the current solution of a MIP is feasible and,
  // if not, try to assign values to continuous variables and discrete
  // variables not at integer values to achieve a feasible
  // solution. Valuable in the case where users make a heuristic
  // (partial) assignment of discrete variables
  assert(model_.isMip() && solution_.value_valid);
  HighsLp& lp = model_.lp_;
  // Determine whether the solution contains undefined values, in
  // order to decide whether to check its feasibility
  const bool contains_undefined_values = solution_.hasUndefined();
  if (!contains_undefined_values) {
    bool valid, integral, feasible;
    // Determine whether this solution is integer feasible
    HighsStatus return_status = assessLpPrimalSolution(
        "", options_, lp, solution_, valid, integral, feasible);
    assert(return_status != HighsStatus::kError);
    assert(valid);
    // If the current solution is integer feasible, then it can be
    // used by MIP solver to get a primal bound
    if (feasible) return HighsStatus::kOk;
  }
  // Save the column bounds and integrality in preparation for fixing
  // the discrete variables when user-supplied values are
  // integer
  std::vector<double> save_col_lower = lp.col_lower_;
  std::vector<double> save_col_upper = lp.col_upper_;
  std::vector<HighsVarType> save_integrality = lp.integrality_;
  const bool have_integrality = (lp.integrality_.size() != 0);
  assert(have_integrality);
  // Count the number of fixed and unfixed discrete variables
  HighsInt num_fixed_discrete_variable = 0;
  HighsInt num_unfixed_discrete_variable = 0;
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    const double primal = solution_.col_value[iCol];
    // Default value is lower bound, unless primal is integer for a
    // discrete variable
    solution_.col_value[iCol] = lp.col_lower_[iCol];
    if (lp.integrality_[iCol] == HighsVarType::kContinuous) continue;
    // Fix discrete variable if its value is defined and integer
    if (primal == kHighsUndefined) {
      num_unfixed_discrete_variable++;
    } else {
      const double lower = lp.col_lower_[iCol];
      const double upper = lp.col_upper_[iCol];
      const HighsVarType type =
          have_integrality ? lp.integrality_[iCol] : HighsVarType::kContinuous;
      double col_infeasibility = 0;
      double integer_infeasibility = 0;
      assessColPrimalSolution(options_, primal, lower, upper, type,
                              col_infeasibility, integer_infeasibility);
      if (integer_infeasibility > options_.mip_feasibility_tolerance) {
        num_unfixed_discrete_variable++;
      } else {
        // Variable is integer feasible, so fix it at this value and
        // remove its integrality
        num_fixed_discrete_variable++;
        lp.col_lower_[iCol] = primal;
        lp.col_upper_[iCol] = primal;
        lp.integrality_[iCol] = HighsVarType::kContinuous;
      }
    }
  }
  assert(!solution_.hasUndefined());
  const HighsInt num_discrete_variable =
      num_unfixed_discrete_variable + num_fixed_discrete_variable;
  const HighsInt num_continuous_variable = lp.num_col_ - num_discrete_variable;
  assert(num_continuous_variable >= 0);
  bool call_run = true;
  const bool few_fixed_discrete_variables =
      10 * num_fixed_discrete_variable < num_discrete_variable;
  if (num_unfixed_discrete_variable == 0) {
    // Solution is integer valued
    if (num_continuous_variable == 0) {
      // There are no continuous variables, so no feasible solution can be
      // deduced
      highsLogUser(options_.log_options, HighsLogType::kInfo,
                   "User-supplied values of discrete variables cannot yield "
                   "feasible solution\n");
      call_run = false;
    } else {
      // Solve an LP, so clear all integrality
      lp.integrality_.clear();
      highsLogUser(
          options_.log_options, HighsLogType::kInfo,
          "Attempting to find feasible solution "
          "by solving LP for user-supplied values of discrete variables\n");
    }
  } else {
    // There are unfixed discrete variables
    if (few_fixed_discrete_variables) {
      // Too few discrete variables are fixed so warn, but still
      // attempt to complete a feasible solution
      highsLogUser(
          options_.log_options, HighsLogType::kWarning,
          "User-supplied values fix only %d / %d discrete variables, "
          "so attempt to complete a feasible solution may be expensive\n",
          int(num_fixed_discrete_variable), int(num_discrete_variable));
    } else {
      highsLogUser(options_.log_options, HighsLogType::kInfo,
                   "Attempting to find feasible solution "
                   "by solving MIP for user-supplied values of %d / %d "
                   "discrete variables\n",
                   int(num_fixed_discrete_variable),
                   int(num_discrete_variable));
    }
  }
  HighsStatus return_status = HighsStatus::kOk;
  // Clear the current solution since either the user solution has
  // been used to fix (a subset of) discrete variables - so a valid
  // solution will be obtained from run() if the local model is
  // feasible - or it's not worth using the user solution
  solution_.clear();
  if (call_run) {
    // Solve the model, using mip_max_start_nodes for
    // mip_max_nodes...
    const HighsInt mip_max_nodes = options_.mip_max_nodes;
    options_.mip_max_nodes = options_.mip_max_start_nodes;
    // Solve the model
    basis_.clear();
    return_status = this->run();
    // ... remembering to recover the original value of mip_max_nodes
    options_.mip_max_nodes = mip_max_nodes;
  }
  // Recover the column bounds and integrality
  lp.col_lower_ = save_col_lower;
  lp.col_upper_ = save_col_upper;
  lp.integrality_ = save_integrality;
  // Handle the error return
  if (return_status == HighsStatus::kError) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Highs::run() error trying to find feasible solution\n");
    return HighsStatus::kError;
  }
  return HighsStatus::kOk;
}